

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_command_queue
clCreateCommandQueueWithPropertiesKHR
          (cl_context context,cl_device_id device,cl_queue_properties_khr *properties,
          cl_int *errcode_ret)

{
  ulong uVar1;
  undefined4 errorCode;
  SConfig *pSVar2;
  undefined8 uVar3;
  SConfig *pSVar4;
  time_point tickStart;
  CLIntercept *pCVar5;
  uint *in_RCX;
  cl_queue_properties_khr *in_RDX;
  cl_device_id in_RSI;
  cl_context in_RDI;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  string propsStr;
  string deviceInfo;
  cl_command_queue retVal;
  cl_queue_properties *newProperties;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd30;
  CLIntercept *in_stack_fffffffffffffd38;
  CLIntercept *in_stack_fffffffffffffd40;
  CObjectTracker *in_stack_fffffffffffffd48;
  CLIntercept *in_stack_fffffffffffffd60;
  allocator *in_stack_fffffffffffffd68;
  cl_queue_properties **in_stack_fffffffffffffd78;
  cl_queue_properties *in_stack_fffffffffffffd80;
  cl_device_id in_stack_fffffffffffffd88;
  CLIntercept *in_stack_fffffffffffffd90;
  cl_device_id in_stack_fffffffffffffdc0;
  cl_queue_properties_khr *enqueueCounter_00;
  cl_context in_stack_fffffffffffffdc8;
  undefined1 includeId;
  CLIntercept *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  CLIntercept *in_stack_fffffffffffffde0;
  time_point in_stack_fffffffffffffde8;
  time_point in_stack_fffffffffffffdf8;
  time_point in_stack_fffffffffffffe00;
  SConfig *in_stack_fffffffffffffe30;
  SConfig *in_stack_fffffffffffffe38;
  SConfig *in_stack_fffffffffffffe40;
  CLIntercept *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe88;
  cl_device_id *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  cl_uint numDevices;
  CLIntercept *in_stack_fffffffffffffea0;
  uint64_t enqueueCounter_01;
  cl_context p_Var6;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  CLIntercept *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffee0;
  cl_queue_properties *in_stack_fffffffffffffee8;
  CLIntercept *in_stack_fffffffffffffef0;
  undefined1 local_e1 [37];
  char *in_stack_ffffffffffffff48;
  CLIntercept *in_stack_ffffffffffffff50;
  uint local_a0 [4];
  string local_90 [32];
  string local_70 [32];
  cl_command_queue local_50;
  cl_queue_properties_khr *local_48;
  uint64_t local_40;
  CLdispatchX *local_38;
  CLIntercept *local_30;
  uint *local_28;
  cl_queue_properties_khr *local_20;
  cl_device_id local_18;
  cl_context local_10;
  cl_command_queue local_8;
  
  numDevices = (cl_uint)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = GetIntercept();
  if ((local_30 == (CLIntercept *)0x0) ||
     (local_38 = CLIntercept::dispatchX
                           (in_stack_fffffffffffffd40,(cl_device_id)in_stack_fffffffffffffd38),
     local_38->clCreateCommandQueueWithPropertiesKHR ==
     (_func_cl_command_queue_cl_context_cl_device_id_cl_queue_properties_khr_ptr_cl_int_ptr *)0x0))
  {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffecc)
    ;
    if (local_28 != (uint *)0x0) {
      *local_28 = 0xffffffde;
    }
    local_8 = (cl_command_queue)0x0;
  }
  else {
    local_40 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffd38);
    local_48 = (cl_queue_properties_khr *)0x0;
    local_50 = (cl_command_queue)0x0;
    std::__cxx11::string::string(local_70);
    std::__cxx11::string::string(local_90);
    pSVar2 = CLIntercept::config(local_30);
    if ((pSVar2->CallLogging & 1U) != 0) {
      CLIntercept::getDeviceInfoString
                (in_stack_fffffffffffffea0,numDevices,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
      CLIntercept::getCommandQueuePropertiesString
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    }
    pSVar2 = CLIntercept::config(local_30);
    if ((pSVar2->CallLogging & 1U) != 0) {
      pCVar5 = local_30;
      enqueueCounter_01 = local_40;
      p_Var6 = local_10;
      uVar3 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffd30 =
           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            *)std::__cxx11::string::c_str();
      CLIntercept::callLoggingEnter
                (pCVar5,"clCreateCommandQueueWithPropertiesKHR",enqueueCounter_01,(cl_kernel)0x0,
                 "context = %p, device = %s, properties = [ %s ]",p_Var6,uVar3);
    }
    pSVar2 = CLIntercept::config(local_30);
    if ((pSVar2->DummyOutOfOrderQueue & 1U) != 0) {
      CLIntercept::dummyCommandQueue
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    }
    includeId = (undefined1)((ulong)in_stack_fffffffffffffdc8 >> 0x38);
    pSVar2 = CLIntercept::config(local_30);
    if (((((((pSVar2->DevicePerformanceTiming & 1U) != 0) ||
           (pSVar2 = CLIntercept::config(local_30), (pSVar2->ITTPerformanceTiming & 1U) != 0)) ||
          (pSVar2 = CLIntercept::config(local_30), (pSVar2->ChromePerformanceTiming & 1U) != 0)) ||
         ((pSVar2 = CLIntercept::config(local_30),
          (pSVar2->DevicePerfCounterEventBasedSampling & 1U) != 0 ||
          (pSVar2 = CLIntercept::config(local_30), (pSVar2->InOrderQueue & 1U) != 0)))) ||
        (pSVar2 = CLIntercept::config(local_30), (pSVar2->NoProfilingQueue & 1U) != 0)) ||
       ((pSVar2 = CLIntercept::config(local_30), pSVar2->DefaultQueuePriorityHint != 0 ||
        (in_stack_fffffffffffffe50 = (CLIntercept *)CLIntercept::config(local_30),
        *(cl_uint *)&(in_stack_fffffffffffffe50->m_Dispatch).clGetKernelArgInfo != 0)))) {
      CLIntercept::createCommandQueuePropertiesOverride
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78);
    }
    local_a0[0] = 0;
    pSVar2 = CLIntercept::config(local_30);
    if ((((((pSVar2->CallLogging & 1U) != 0) ||
          (in_stack_fffffffffffffe40 = CLIntercept::config(local_30),
          (in_stack_fffffffffffffe40->ErrorLogging & 1U) != 0)) ||
         (in_stack_fffffffffffffe38 = CLIntercept::config(local_30),
         (in_stack_fffffffffffffe38->ErrorAssert & 1U) != 0)) ||
        (in_stack_fffffffffffffe30 = CLIntercept::config(local_30),
        (in_stack_fffffffffffffe30->NoErrors & 1U) != 0)) && (local_28 == (uint *)0x0)) {
      local_28 = local_a0;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffd30);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffd30);
    pSVar4 = CLIntercept::config(local_30);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_30), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffff48 = (char *)std::chrono::_V2::steady_clock::now();
    }
    pSVar4 = CLIntercept::config(local_30);
    if ((pSVar4->DevicePerfCounterEventBasedSampling & 1U) != 0) {
      if ((local_50 == (cl_command_queue)0x0) && (local_48 != (cl_queue_properties_khr *)0x0)) {
        local_50 = CLIntercept::createMDAPICommandQueue
                             (in_stack_fffffffffffffe50,(cl_context)pSVar2,
                              (cl_device_id)in_stack_fffffffffffffe40,
                              (cl_queue_properties *)in_stack_fffffffffffffe38,
                              (cl_int *)in_stack_fffffffffffffe30);
      }
      if (local_50 == (cl_command_queue)0x0) {
        local_50 = CLIntercept::createMDAPICommandQueue
                             (in_stack_fffffffffffffe50,(cl_context)pSVar2,
                              (cl_device_id)in_stack_fffffffffffffe40,
                              (cl_queue_properties *)in_stack_fffffffffffffe38,
                              (cl_int *)in_stack_fffffffffffffe30);
      }
    }
    if ((local_50 == (cl_command_queue)0x0) && (local_48 != (cl_queue_properties_khr *)0x0)) {
      in_stack_fffffffffffffe00.__d.__r =
           (duration)
           (*local_38->clCreateCommandQueueWithPropertiesKHR)
                     (local_10,local_18,local_48,(cl_int *)local_28);
      local_50 = (cl_command_queue)in_stack_fffffffffffffe00.__d.__r;
    }
    if (local_50 == (cl_command_queue)0x0) {
      in_stack_fffffffffffffdf8.__d.__r =
           (duration)
           (*local_38->clCreateCommandQueueWithPropertiesKHR)
                     (local_10,local_18,local_20,(cl_int *)local_28);
      local_50 = (cl_command_queue)in_stack_fffffffffffffdf8.__d.__r;
    }
    tickStart.__d.__r = (duration)CLIntercept::config(local_30);
    if ((((ulong)(((CLIntercept *)tickStart.__d.__r)->m_Dispatch).clCreateContextFromType & 1) != 0)
       || (in_stack_fffffffffffffde8.__d.__r = (duration)CLIntercept::config(local_30),
          (((SConfig *)in_stack_fffffffffffffde8.__d.__r)->ChromeCallLogging & 1U) != 0)) {
      register0x00000000 = std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffff50 = (CLIntercept *)register0x00000000;
      in_stack_fffffffffffffde0 = (CLIntercept *)CLIntercept::config(local_30);
      if ((((ulong)(in_stack_fffffffffffffde0->m_Dispatch).clCreateContextFromType & 1) != 0) &&
         (in_stack_fffffffffffffddf =
               CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_30,local_40),
         (bool)in_stack_fffffffffffffddf)) {
        in_stack_fffffffffffffdd0 = (CLIntercept *)local_e1;
        pCVar5 = local_30;
        std::allocator<char>::allocator();
        includeId = (undefined1)((ulong)pCVar5 >> 0x38);
        std::__cxx11::string::string
                  ((string *)(local_e1 + 1),"",(allocator *)in_stack_fffffffffffffdd0);
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)tickStart.__d.__r,(char *)in_stack_fffffffffffffde8.__d.__r,
                   (string *)in_stack_fffffffffffffde0,in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdf8);
        std::__cxx11::string::~string((string *)(local_e1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_e1);
      }
    }
    enqueueCounter_00 = local_48;
    if (local_48 != (cl_queue_properties_khr *)0x0) {
      operator_delete__(local_48);
      enqueueCounter_00 = local_48;
    }
    local_48 = (cl_queue_properties_khr *)0x0;
    pSVar2 = CLIntercept::config(local_30);
    if (((((pSVar2->ErrorLogging & 1U) != 0) ||
         (pSVar2 = CLIntercept::config(local_30), (pSVar2->ErrorAssert & 1U) != 0)) ||
        (pSVar2 = CLIntercept::config(local_30), (pSVar2->NoErrors & 1U) != 0)) && (*local_28 != 0))
    {
      pSVar2 = CLIntercept::config(local_30);
      uVar3 = stack0xffffffffffffff40;
      if ((pSVar2->ErrorLogging & 1U) != 0) {
        uVar1 = (ulong)stack0xffffffffffffff40 >> 0x20;
        errorCode = (int)uVar1;
        unique0x10000c1e = uVar3;
        CLIntercept::logError(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,errorCode);
      }
      pSVar2 = CLIntercept::config(local_30);
      if ((pSVar2->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar2 = CLIntercept::config(local_30);
      if ((pSVar2->NoErrors & 1U) != 0) {
        *local_28 = 0;
      }
    }
    pSVar2 = CLIntercept::config(local_30);
    if ((pSVar2->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(local_30);
      CObjectTracker::AddAllocation<_cl_command_queue*>
                (in_stack_fffffffffffffd48,(_cl_command_queue *)in_stack_fffffffffffffd40);
    }
    pSVar2 = CLIntercept::config(local_30);
    if ((pSVar2->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (local_30,"clCreateCommandQueueWithPropertiesKHR",(cl_int)(ulong)*local_28,
                 (cl_event *)0x0,(cl_sync_point_khr *)0x0,"returned %p",local_50);
    }
    pCVar5 = (CLIntercept *)CLIntercept::config(local_30);
    if (((pCVar5->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U) != 0) {
      in_stack_fffffffffffffd68 = (allocator *)&stack0xfffffffffffffee7;
      in_stack_fffffffffffffd60 = local_30;
      std::allocator<char>::allocator();
      in_stack_fffffffffffffed0 = in_stack_ffffffffffffff50;
      std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,"",in_stack_fffffffffffffd68);
      CLIntercept::chromeCallLoggingExit
                (in_stack_fffffffffffffde0,
                 (char *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                 (string *)in_stack_fffffffffffffdd0,(bool)includeId,(uint64_t)enqueueCounter_00,
                 tickStart,in_stack_fffffffffffffde8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
    }
    if ((local_50 != (cl_command_queue)0x0) &&
       ((pSVar2 = CLIntercept::config(local_30), (pSVar2->ChromePerformanceTiming & 1U) != 0 ||
        (pSVar2 = CLIntercept::config(local_30),
        (pSVar2->Emulate_cl_intel_unified_shared_memory & 1U) != 0)))) {
      CLIntercept::addQueue
                (pCVar5,(cl_context)in_stack_fffffffffffffd68,
                 (cl_command_queue)in_stack_fffffffffffffd60);
      pSVar2 = CLIntercept::config(local_30);
      if ((pSVar2->ChromePerformanceTiming & 1U) != 0) {
        CLIntercept::chromeRegisterCommandQueue
                  (in_stack_fffffffffffffed0,
                   (cl_command_queue)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      }
    }
    pSVar2 = CLIntercept::config(local_30);
    if (((pSVar2->QueueInfoLogging & 1U) != 0) && (local_50 != (cl_command_queue)0x0)) {
      CLIntercept::logQueueInfo
                ((CLIntercept *)tickStart.__d.__r,(cl_device_id)in_stack_fffffffffffffde8.__d.__r,
                 (cl_command_queue)in_stack_fffffffffffffde0);
    }
    local_8 = local_50;
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
  }
  return local_8;
}

Assistant:

CL_API_ENTRY cl_command_queue CL_API_CALL clCreateCommandQueueWithPropertiesKHR(
    cl_context context,
    cl_device_id device,
    const cl_queue_properties_khr* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(device);
        if( dispatchX.clCreateCommandQueueWithPropertiesKHR )
        {
            GET_ENQUEUE_COUNTER();

            cl_queue_properties*    newProperties = NULL;
            cl_command_queue    retVal = NULL;

            std::string deviceInfo;
            std::string propsStr;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getDeviceInfoString(
                    1,
                    &device,
                    deviceInfo );
                pIntercept->getCommandQueuePropertiesString(
                    properties,
                    propsStr );
            }
            CALL_LOGGING_ENTER( "context = %p, device = %s, properties = [ %s ]",
                context,
                deviceInfo.c_str(),
                propsStr.c_str() );
            DUMMY_COMMAND_QUEUE( context, device );
            CREATE_COMMAND_QUEUE_OVERRIDE_INIT( device, properties, newProperties );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

#if defined(USE_MDAPI)
            if( pIntercept->config().DevicePerfCounterEventBasedSampling )
            {
                if( ( retVal == NULL ) && newProperties )
                {
                    retVal = pIntercept->createMDAPICommandQueue(
                        context,
                        device,
                        newProperties,
                        errcode_ret );
                }
                if( retVal == NULL )
                {
                    retVal = pIntercept->createMDAPICommandQueue(
                        context,
                        device,
                        properties,
                        errcode_ret );
                }
            }
#endif

            if( ( retVal == NULL ) && newProperties )
            {
                retVal = dispatchX.clCreateCommandQueueWithPropertiesKHR(
                    context,
                    device,
                    newProperties,
                    errcode_ret );
            }
            if( retVal == NULL )
            {
                retVal = dispatchX.clCreateCommandQueueWithPropertiesKHR(
                    context,
                    device,
                    properties,
                    errcode_ret );
            }

            HOST_PERFORMANCE_TIMING_END();
            COMMAND_QUEUE_PROPERTIES_CLEANUP( newProperties );
            CHECK_ERROR( errcode_ret[0] );
            ADD_OBJECT_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );
            ADD_QUEUE( context, retVal );
            QUEUE_INFO_LOGGING( device, retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}